

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.hpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerImpl::EnergyScan
          (Error *__return_storage_ptr__,CommissionerImpl *this,uint32_t param_1,uint8_t param_2,
          uint16_t param_3,uint16_t param_4,string *param_5)

{
  undefined6 in_register_0000008a;
  format_args args;
  string local_78;
  undefined1 local_58 [72];
  
  args.field_1._2_6_ = in_register_0000008a;
  args.field_1._0_2_ = param_4;
  args.desc_ = (unsigned_long_long)local_58;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_78,(v10 *)(anon_var_dwarf_6723d3 + 9),(string_view)ZEXT816(0),args);
  __return_storage_ptr__->mCode = kUnimplemented;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->mMessage,local_78._M_dataplus._M_p,
             local_78._M_dataplus._M_p + local_78._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error EnergyScan(uint32_t, uint8_t, uint16_t, uint16_t, const std::string &) override
    {
        return ERROR_UNIMPLEMENTED("");
    }